

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O2

void __thiscall
Nova::Simplex_Mesh<4>::Find_And_Append_Adjacent_Elements
          (Simplex_Mesh<4> *this,int simplex,Vector<int,_3,_true> *face)

{
  int i;
  bool bVar1;
  Array<int> *pAVar2;
  int *piVar3;
  size_t t;
  ulong uVar4;
  int simplex2;
  Vector<int,_2,_true> other_nodes;
  int local_3c [3];
  
  i = (face->_data)._M_elems[0];
  uVar4 = 0;
  Vector<int,_3,_true>::Remove_Index((Vector<int,_3,_true> *)(local_3c + 1),(int)face);
  while( true ) {
    pAVar2 = Array<Nova::Array<int>_>::operator()(this->incident_elements,i);
    if ((ulong)((long)(pAVar2->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pAVar2->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar4) break;
    pAVar2 = Array<Nova::Array<int>_>::operator()(this->incident_elements,i);
    piVar3 = Array<int>::operator()(pAVar2,(int)uVar4);
    local_3c[0] = *piVar3;
    if (local_3c[0] != simplex) {
      bVar1 = Nodes_In_Simplex<2>(this,(Vector<int,_2,_true> *)(local_3c + 1),local_3c[0]);
      if (bVar1) {
        pAVar2 = Array<Nova::Array<int>_>::operator()(this->adjacent_elements,simplex);
        Array<int>::Append_Unique(pAVar2,local_3c);
      }
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Find_And_Append_Adjacent_Elements(const int simplex,const Vector<int,d-1>& face)
{
    int first_node=face(0);Vector<int,d-2> other_nodes=face.Remove_Index(0);
    for(size_t t=0;t<(*incident_elements)(first_node).size();++t){
        int simplex2=(*incident_elements)(first_node)(t);
        if(simplex2!=simplex && Nodes_In_Simplex(other_nodes,simplex2))
            (*adjacent_elements)(simplex).Append_Unique(simplex2);}
}